

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

string * __thiscall
pbrt::CuboidMedium<pbrt::CloudMediumProvider>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CuboidMedium<pbrt::CloudMediumProvider> *this)

{
  CloudMediumProvider *v;
  
  v = this->provider;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CloudMediumProvider_const&,pbrt::Bounds3<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::HGPhaseFunction_const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pbrt::Point3<int>const&>
            (__return_storage_ptr__,
             "[ CuboidMedium provider: %s mediumBounds: %s sigma_a_spec: %s sigma_s_spec: %s sigScale: %f phase: %s maxDensityGrid: %s gridResolution: %s ]"
             ,v,&this->mediumBounds,&this->sigma_a_spec,&this->sigma_s_spec,&this->sigScale,
             &this->phase,&this->maxDensityGrid,&this->gridResolution);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CuboidMedium provider: %s mediumBounds: %s "
                            "sigma_a_spec: %s sigma_s_spec: %s sigScale: %f phase: %s "
                            "maxDensityGrid: %s gridResolution: %s ]",
                            *provider, mediumBounds, sigma_a_spec, sigma_s_spec, sigScale,
                            phase, maxDensityGrid, gridResolution);
    }